

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_waveform_generation.cc
# Opt level: O3

void __thiscall
sptk::PeriodicWaveformGeneration::PeriodicWaveformGeneration
          (PeriodicWaveformGeneration *this,double unvoiced_value,bool strict,
          InputSourceInterpolationWithMagicNumber *input_source)

{
  int iVar1;
  
  this->_vptr_PeriodicWaveformGeneration = (_func_int **)&PTR__PeriodicWaveformGeneration_00110c18;
  this->unvoiced_value_ = unvoiced_value;
  this->strict_ = strict;
  this->input_source_ = input_source;
  this->is_valid_ = true;
  this->phase_ = 0.0;
  this->voiced_pitch_ = 0.0;
  this->extending_ = false;
  if ((input_source != (InputSourceInterpolationWithMagicNumber *)0x0) &&
     (iVar1 = (*(input_source->super_InputSourceInterface)._vptr_InputSourceInterface[3])
                        (input_source), (char)iVar1 != '\0')) {
    return;
  }
  this->is_valid_ = false;
  return;
}

Assistant:

PeriodicWaveformGeneration::PeriodicWaveformGeneration(
    double unvoiced_value, bool strict,
    InputSourceInterpolationWithMagicNumber* input_source)
    : unvoiced_value_(unvoiced_value),
      strict_(strict),
      input_source_(input_source),
      is_valid_(true),
      phase_(0.0),
      voiced_pitch_(0.0),
      extending_(false) {
  if (NULL == input_source_ || !input_source_->IsValid()) {
    is_valid_ = false;
    return;
  }
}